

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O2

void __thiscall Threadpool<Workerthread>::exit(Threadpool<Workerthread> *this,int __status)

{
  pointer ppWVar1;
  Workerthread **t;
  pointer ppWVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m);
  LOCK();
  (this->stop)._M_base._M_i = true;
  UNLOCK();
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unlock(&local_20);
  ppWVar1 = (this->workers).super__Vector_base<Workerthread_*,_std::allocator<Workerthread_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppWVar2 = (this->workers).super__Vector_base<Workerthread_*,_std::allocator<Workerthread_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppWVar2 != ppWVar1;
      ppWVar2 = ppWVar2 + 1) {
    std::thread::join();
    if (*ppWVar2 != (Workerthread *)0x0) {
      (*(*ppWVar2)->_vptr_Workerthread[1])();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void exit() {
		std::unique_lock<std::mutex> lock(m);
		stop = true;
		cv_task.notify_all();
		lock.unlock();
		for (auto& t : workers) {
			t->thread().join();
			delete t;
		}
	}